

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::Sit(Map *this,Character *from,SitState sit_type)

{
  Character *other;
  bool bVar1;
  int num;
  undefined7 in_register_00000011;
  PacketFamily family;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  from->sitting = sit_type;
  Character::CancelSpell(from);
  family = PACKET_SIT;
  if ((int)CONCAT71(in_register_00000011,sit_type) == 1) {
    family = PACKET_CHAIR;
  }
  PacketBuilder::PacketBuilder(&local_60,family,PACKET_PLAYER,6);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort(&local_60,num);
  PacketBuilder::AddChar(&local_60,(uint)from->x);
  PacketBuilder::AddChar(&local_60,(uint)from->y);
  PacketBuilder::AddChar(&local_60,(uint)from->direction);
  PacketBuilder::AddChar(&local_60,0);
  p_Var2 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->characters) {
    do {
      other = (Character *)p_Var2[1]._M_next;
      if (other != from) {
        bVar1 = Character::InRange(from,other);
        if (bVar1) {
          Character::Send(other,&local_60);
        }
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->characters);
  }
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void Map::Sit(Character *from, SitState sit_type)
{
	from->sitting = sit_type;

	from->CancelSpell();

	PacketBuilder builder((sit_type == SIT_CHAIR) ? PACKET_CHAIR : PACKET_SIT, PACKET_PLAYER, 6);
	builder.AddShort(from->PlayerID());
	builder.AddChar(from->x);
	builder.AddChar(from->y);
	builder.AddChar(from->direction);
	builder.AddChar(0); // ?

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}